

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  long lVar1;
  undefined8 *puVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  int iVar6;
  long lVar7;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  _Var8;
  solver_failure *this_00;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long unaff_RBP;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  uint *puVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar19 [32];
  
  if (r_size < 4) {
LAB_0057e567:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
              ();
LAB_0057e56c:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_0057e56c;
    *(int *)(this + 100) = bk_min;
    *(int *)(this + 0x68) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    ctx = (EVP_PKEY_CTX *)(ulong)(uint)r_size;
    iVar4 = shared_subvector::init((shared_subvector *)this,ctx);
    if ((char)iVar4 == '\0') goto LAB_0057e576;
    sVar5 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x60) = sVar5;
    if (sVar5 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar12 = (ulong)(r_size + 7U & 0xfffffff8);
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vpbroadcastq_avx512f();
      auVar27 = vpbroadcastq_avx512f();
      do {
        uVar15 = vpcmpuq_avx512f(auVar24,auVar25,2);
        auVar28 = vpsllq_avx512f(auVar24,4);
        uVar12 = uVar12 - 8;
        vpaddq_avx512f(auVar26,auVar28);
        auVar28 = vgatherqpd_avx512f(*(undefined8 *)
                                      ((long)&((reduced_cost->_M_t).
                                               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                                               .
                                               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                                              ._M_head_impl)->value + unaff_RBP));
        bVar3 = (byte)uVar15;
        auVar30._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar28._8_8_;
        auVar30._0_8_ = (ulong)(bVar3 & 1) * auVar28._0_8_;
        auVar30._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar28._16_8_;
        auVar30._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar28._24_8_;
        auVar30._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar28._32_8_;
        auVar30._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar28._40_8_;
        auVar30._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar28._48_8_;
        auVar30._56_8_ = (uVar15 >> 7) * auVar28._56_8_;
        auVar29 = vpsllq_avx512f(auVar24,5);
        auVar28._8_8_ = 8;
        auVar28._0_8_ = 8;
        auVar28._16_8_ = 8;
        auVar28._24_8_ = 8;
        auVar28._32_8_ = 8;
        auVar28._40_8_ = 8;
        auVar28._48_8_ = 8;
        auVar28._56_8_ = 8;
        auVar24 = vpaddq_avx512f(auVar24,auVar28);
        auVar28 = vpaddq_avx512f(auVar27,auVar29);
        vscatterqpd_avx512f(ZEXT864(*(ulong *)(this + 0x20)) + auVar29,uVar15,auVar30);
        auVar19 = vpgatherqd_avx512f(*(undefined8 *)(ctx + 8));
        auVar20._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
        auVar20._0_4_ = (uint)(bVar3 & 1) * auVar19._0_4_;
        auVar20._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
        auVar20._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
        auVar20._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
        auVar20._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
        auVar20._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
        auVar20._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar19._28_4_;
        auVar22 = auVar28._0_32_;
        vpscatterqd_avx512f(ZEXT832(0x18) + auVar22,uVar15,auVar20);
        auVar19 = vpgatherqd_avx512f(*(undefined8 *)(ctx + 0xc));
        auVar21._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
        auVar21._0_4_ = (uint)(bVar3 & 1) * auVar19._0_4_;
        auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
        auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
        auVar21._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
        auVar21._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
        auVar21._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
        auVar21._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar19._28_4_;
        vpscatterqd_avx512f(ZEXT832(0x14) + auVar22,uVar15,auVar21);
        auVar19 = vpabsd_avx2(auVar21);
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar22,uVar15,auVar19);
        vpscatterqd_avx512f(ZEXT832(0x1c) + auVar22,uVar15,
                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      } while (uVar12 != 0);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar17 = *(long *)(this + 0x20);
      lVar7 = *(long *)(this + 0x28);
      if (lVar17 != lVar7) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar17,lVar7,(int)LZCOUNT(lVar7 - lVar17 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar17,lVar7);
        lVar17 = *(long *)(this + 0x20);
        lVar7 = *(long *)(this + 0x28);
      }
      iVar4 = *(int *)(this + 100);
      iVar11 = *(int *)(this + 0x68);
      if (lVar7 - lVar17 != 0) {
        lVar13 = lVar7 - lVar17 >> 5;
        piVar14 = (int *)(lVar17 + 0x14);
        do {
          if (*piVar14 < 0) {
            iVar4 = iVar4 + piVar14[-1];
            iVar11 = iVar11 + piVar14[-1];
            *(int *)(this + 100) = iVar4;
            *(int *)(this + 0x68) = iVar11;
          }
          piVar14 = piVar14 + 8;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      *(undefined8 *)(lVar7 + -0x18) = *(undefined8 *)(lVar7 + -0x20);
      iVar6 = (int)((ulong)(lVar7 - lVar17) >> 5);
      if (1 < iVar6) {
        lVar7 = (ulong)(iVar6 - 2) << 5;
        do {
          *(double *)(lVar17 + 8 + lVar7) =
               *(double *)(lVar17 + 0x28 + lVar7) + *(double *)(lVar17 + lVar7);
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
      }
      if (iVar11 == iVar4) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      lVar17 = *(long *)(this + 0x28);
      lVar7 = *(long *)(this + 0x20);
      uVar12 = lVar17 - lVar7;
      if ((int)(uVar12 >> 5) != 0) {
        lVar13 = *(long *)this;
        lVar1 = *(long *)(this + 8);
        uVar9 = *(uint *)(this + 0x60);
        puVar16 = (uint *)(lVar7 + 0x1c);
        uVar15 = uVar12 >> 5 & 0xffffffff;
        do {
          uVar10 = (ulong)uVar9;
          if ((int)puVar16[-2] < 1) {
            if ((ulong)(lVar1 - lVar13) <= uVar10) goto LAB_0057e562;
            bVar18 = *(char *)(lVar13 + uVar10) == '\0';
          }
          else {
            if ((ulong)(lVar1 - lVar13) <= uVar10) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
                        ();
LAB_0057e562:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
                        ();
              goto LAB_0057e567;
            }
            bVar18 = *(char *)(lVar13 + uVar10) != '\0';
          }
          uVar9 = uVar9 + 1;
          *puVar16 = (uint)bVar18;
          puVar16 = puVar16 + 8;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      if (lVar7 != lVar17) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar7,lVar17,(int)LZCOUNT((long)uVar12 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar7,lVar17);
      }
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                        (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      auVar24 = vpbroadcastq_avx512f(ZEXT816(8));
      puVar2 = *(undefined8 **)(this + 0x20);
      lVar17 = (long)*(item **)(this + 0x28) - (long)puVar2;
      if (lVar17 != 0) {
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26 = vpbroadcastq_avx512f();
        uVar12 = (lVar17 >> 5) + 7U & 0xfffffffffffffff8;
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vpbroadcastq_avx512f();
        do {
          uVar15 = vpcmpuq_avx512f(auVar25,auVar27,2);
          auVar30 = vpsllq_avx512f(auVar25,5);
          uVar12 = uVar12 - 8;
          vpaddq_avx512f(auVar26,auVar30);
          auVar30 = vgatherqpd_avx512f(*puVar2);
          bVar3 = (byte)uVar15;
          auVar29._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar30._8_8_;
          auVar29._0_8_ = (ulong)(bVar3 & 1) * auVar30._0_8_;
          auVar29._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar30._16_8_;
          auVar29._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar30._24_8_;
          auVar29._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar30._32_8_;
          auVar29._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar30._40_8_;
          auVar29._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar30._48_8_;
          auVar29._56_8_ = (uVar15 >> 7) * auVar30._56_8_;
          auVar30 = vpsllq_avx512f(auVar25,4);
          auVar25 = vpaddq_avx512f(auVar25,auVar24);
          auVar31 = vpaddq_avx512f(auVar28,auVar30);
          vscatterqpd_avx512f(ZEXT864((reduced_cost->_M_t).
                                      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                                      ._M_head_impl) + auVar30,uVar15,auVar29);
          auVar19 = vpgatherqd_avx512f(*(undefined8 *)(unaff_RBP + 0x18));
          auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
          auVar22._0_4_ = (uint)(bVar3 & 1) * auVar19._0_4_;
          auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
          auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
          auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
          auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
          auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
          auVar22._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar19._28_4_;
          vpscatterqd_avx512f(ZEXT832(8) + auVar31._0_32_,uVar15,auVar22);
          auVar19 = vpgatherqd_avx512f(*(undefined8 *)(unaff_RBP + 0x14));
          auVar23._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar19._4_4_;
          auVar23._0_4_ = (uint)(bVar3 & 1) * auVar19._0_4_;
          auVar23._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar19._8_4_;
          auVar23._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar19._12_4_;
          auVar23._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar19._16_4_;
          auVar23._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar19._20_4_;
          auVar23._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar19._24_4_;
          auVar23._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar19._28_4_;
          vpscatterqd_avx512f(ZEXT832(0xc) + auVar31._0_32_,uVar15,auVar23);
        } while (uVar12 != 0);
      }
      if (_Var8._M_current == *(item **)(this + 0x28)) {
        uVar9 = -(uint)(*(int *)((long)puVar2 + 0x1c) == 0) | r_size;
      }
      else {
        uVar9 = (int)((ulong)((long)_Var8._M_current - (long)puVar2) >> 5) - 1;
      }
      return uVar9;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>>>
            ();
LAB_0057e576:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }